

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void json11::dump(string *value,string *out)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  char *pcVar4;
  char local_29 [8];
  char buf [8];
  char ch;
  size_t i;
  string *out_local;
  string *value_local;
  
  std::__cxx11::string::operator+=((string *)out,'\"');
  for (stack0xffffffffffffffe0 = 0; uVar1 = stack0xffffffffffffffe0,
      uVar2 = std::__cxx11::string::length(), uVar1 < uVar2;
      register0x00000000 = stack0xffffffffffffffe0 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)value);
    buf[0] = *pbVar3;
    if (buf[0] == 0x5c) {
      std::__cxx11::string::operator+=((string *)out,"\\\\");
    }
    else if (buf[0] == 0x22) {
      std::__cxx11::string::operator+=((string *)out,"\\\"");
    }
    else if (buf[0] == 8) {
      std::__cxx11::string::operator+=((string *)out,"\\b");
    }
    else if (buf[0] == 0xc) {
      std::__cxx11::string::operator+=((string *)out,"\\f");
    }
    else if (buf[0] == 10) {
      std::__cxx11::string::operator+=((string *)out,"\\n");
    }
    else if (buf[0] == 0xd) {
      std::__cxx11::string::operator+=((string *)out,"\\r");
    }
    else if (buf[0] == 9) {
      std::__cxx11::string::operator+=((string *)out,"\\t");
    }
    else if ((byte)buf[0] < 0x20) {
      snprintf(local_29,8,"\\u%04x",(ulong)(uint)(int)buf[0]);
      std::__cxx11::string::operator+=((string *)out,local_29);
    }
    else if (((buf[0] == 0xe2) &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar4 == -0x80)) &&
            (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar4 == -0x58)) {
      std::__cxx11::string::operator+=((string *)out,"\\u2028");
      register0x00000000 = stack0xffffffffffffffe0 + 2;
    }
    else if (((buf[0] == -0x1e) &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar4 == -0x80)) &&
            (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)value), *pcVar4 == -0x57)) {
      std::__cxx11::string::operator+=((string *)out,"\\u2029");
      register0x00000000 = stack0xffffffffffffffe0 + 2;
    }
    else {
      std::__cxx11::string::operator+=((string *)out,buf[0]);
    }
  }
  std::__cxx11::string::operator+=((string *)out,'\"');
  return;
}

Assistant:

static void dump(const string &value, string &out) {
    out += '"';
    for (size_t i = 0; i < value.length(); i++) {
        const char ch = value[i];
        if (ch == '\\') {
            out += "\\\\";
        } else if (ch == '"') {
            out += "\\\"";
        } else if (ch == '\b') {
            out += "\\b";
        } else if (ch == '\f') {
            out += "\\f";
        } else if (ch == '\n') {
            out += "\\n";
        } else if (ch == '\r') {
            out += "\\r";
        } else if (ch == '\t') {
            out += "\\t";
        } else if (static_cast<uint8_t>(ch) <= 0x1f) {
            char buf[8];
            snprintf(buf, sizeof buf, "\\u%04x", ch);
            out += buf;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa8) {
            out += "\\u2028";
            i += 2;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa9) {
            out += "\\u2029";
            i += 2;
        } else {
            out += ch;
        }
    }
    out += '"';
}